

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_dumpstack(lua_State *L,SBuf *sb,char *fmt,int depth)

{
  uint uVar1;
  int iVar2;
  cTValue *pcVar3;
  ulong uVar4;
  char *pcVar5;
  uint in_ECX;
  byte *pbVar6;
  byte *in_RDX;
  GCfunc *in_RSI;
  lua_State *in_RDI;
  BCLine line;
  GCproto *pt_1;
  GCproto *pt;
  char *what;
  char *name;
  int c;
  uint8_t *p;
  GCfunc *fn;
  cTValue *nextframe;
  cTValue *frame;
  int size;
  MSize lastlen;
  int pathstrip;
  int dir;
  int level;
  char *p_5;
  char *p_4;
  char *p_3;
  char *p_2;
  char *p_1;
  undefined4 in_stack_fffffffffffffe58;
  MSize in_stack_fffffffffffffe5c;
  GCfunc *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  MSize in_stack_fffffffffffffe6c;
  GCfunc *in_stack_fffffffffffffe70;
  lua_State *in_stack_fffffffffffffe78;
  cTValue *name_00;
  undefined4 in_stack_fffffffffffffe90;
  MSize in_stack_fffffffffffffe94;
  lua_State *in_stack_fffffffffffffe98;
  lua_State *local_150;
  byte *local_140;
  int local_120;
  int local_11c;
  undefined4 local_118;
  int local_114;
  uint local_110;
  uint local_10c;
  byte *local_108;
  GCfunc *local_100;
  lua_State *local_f8;
  char *local_f0;
  uint local_e4;
  GCfunc *local_e0;
  char *local_d8;
  undefined4 local_cc;
  GCfunc *local_c8;
  char *local_c0;
  undefined4 local_b4;
  GCfunc *local_b0;
  char *local_a8;
  undefined4 local_9c;
  GCfunc *local_98;
  char *local_90;
  undefined4 local_84;
  GCfunc *local_80;
  undefined4 local_74;
  GCfunc *local_70;
  char *local_68;
  undefined4 local_5c;
  GCfunc *local_58;
  char *local_50;
  undefined4 local_44;
  GCfunc *local_40;
  char *local_38;
  undefined4 local_2c;
  GCfunc *local_28;
  char *local_20;
  undefined4 local_14;
  GCfunc *local_10;
  char *local_8;
  
  local_110 = 0;
  local_114 = 1;
  local_118 = 1;
  local_11c = 0;
  local_10c = in_ECX;
  local_108 = in_RDX;
  local_100 = in_RSI;
  local_f8 = in_RDI;
  if ((int)in_ECX < 0) {
    local_110 = in_ECX ^ 0xffffffff;
    local_114 = -1;
    local_10c = 0xffffffff;
  }
  for (; local_110 != local_10c; local_110 = local_114 + local_110) {
    pcVar3 = lj_debug_frame(local_f8,local_110,&local_120);
    if (pcVar3 != (cTValue *)0x0) {
      if (local_120 == 0) {
        name_00 = (cTValue *)0x0;
      }
      else {
        name_00 = pcVar3 + local_120;
      }
      uVar4 = (ulong)(pcVar3->u32).lo;
      local_140 = local_108;
LAB_001176b3:
      pbVar6 = local_140 + 1;
      uVar1 = (uint)*local_140;
      if (uVar1 != 0) {
        local_140 = pbVar6;
        switch(uVar1) {
        case 0x46:
        case 0x66:
          pcVar5 = lj_debug_funcname(in_stack_fffffffffffffe98,
                                     (cTValue *)
                                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                     (char **)name_00);
          if (pcVar5 != (char *)0x0) {
            if (((uVar1 == 0x46) && (*(char *)(uVar4 + 6) == '\0')) &&
               (*(int *)((ulong)*(uint *)(uVar4 + 0x10) - 0x14) != -1)) {
              debug_putchunkname((SBuf *)in_stack_fffffffffffffe78,
                                 (GCproto *)&in_stack_fffffffffffffe70->c,in_stack_fffffffffffffe6c)
              ;
              local_80 = local_100;
              local_84 = 0x3a;
              local_70 = local_100;
              local_74 = 1;
              if (((MRef *)&(local_100->c).marked)->ptr32 == (local_100->c).nextgc.gcptr32) {
                local_68 = lj_buf_more2((SBuf *)&in_stack_fffffffffffffe60->c,
                                        in_stack_fffffffffffffe5c);
              }
              else {
                local_68 = (char *)(ulong)(local_100->c).nextgc.gcptr32;
              }
              local_90 = local_68 + 1;
              *local_68 = (char)local_84;
              (local_80->c).nextgc.gcptr32 = (uint32_t)local_90;
            }
            in_stack_fffffffffffffe70 = local_100;
            in_stack_fffffffffffffe78 = local_150;
            strlen((char *)local_150);
            lj_buf_putmem((SBuf *)&in_stack_fffffffffffffe70->c,
                          (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                          (MSize)((ulong)in_stack_fffffffffffffe60 >> 0x20));
            break;
          }
        case 0x6c:
          if (*(char *)(uVar4 + 6) == '\0') {
            in_stack_fffffffffffffe98 = (lua_State *)((ulong)*(uint *)(uVar4 + 0x10) - 0x40);
            iVar2 = debug_putchunkname((SBuf *)in_stack_fffffffffffffe78,
                                       (GCproto *)&in_stack_fffffffffffffe70->c,
                                       in_stack_fffffffffffffe6c);
            if (iVar2 != 0) {
              if (uVar1 == 0x6c) {
                in_stack_fffffffffffffe6c =
                     lj_debug_frameline(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                        (cTValue *)
                                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ));
              }
              else {
                in_stack_fffffffffffffe6c = (in_stack_fffffffffffffe98->env).gcptr32;
              }
              local_98 = local_100;
              local_9c = 0x3a;
              local_58 = local_100;
              local_5c = 1;
              in_stack_fffffffffffffe94 = in_stack_fffffffffffffe6c;
              if (((MRef *)&(local_100->c).marked)->ptr32 == (local_100->c).nextgc.gcptr32) {
                local_50 = lj_buf_more2((SBuf *)&in_stack_fffffffffffffe60->c,
                                        in_stack_fffffffffffffe5c);
              }
              else {
                local_50 = (char *)(ulong)(local_100->c).nextgc.gcptr32;
              }
              local_a8 = local_50 + 1;
              *local_50 = (char)local_9c;
              (local_98->c).nextgc.gcptr32 = (uint32_t)local_a8;
              in_stack_fffffffffffffe5c = in_stack_fffffffffffffe94;
              if ((int)in_stack_fffffffffffffe94 < 0) {
                in_stack_fffffffffffffe5c = (in_stack_fffffffffffffe98->env).gcptr32;
              }
              in_stack_fffffffffffffe60 = local_100;
              lj_strfmt_putint((SBuf *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                               ,0);
            }
          }
          else if (*(byte *)(uVar4 + 6) < 2) {
            local_c8 = local_100;
            local_cc = 0x40;
            local_28 = local_100;
            local_2c = 1;
            if (((MRef *)&(local_100->c).marked)->ptr32 == (local_100->c).nextgc.gcptr32) {
              local_20 = lj_buf_more2((SBuf *)&in_stack_fffffffffffffe60->c,
                                      in_stack_fffffffffffffe5c);
            }
            else {
              local_20 = (char *)(ulong)(local_100->c).nextgc.gcptr32;
            }
            local_d8 = local_20 + 1;
            *local_20 = (char)local_cc;
            (local_c8->c).nextgc.gcptr32 = (uint32_t)local_d8;
            lj_strfmt_putptr((SBuf *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                             (void *)0x117c3a);
          }
          else {
            lj_buf_putmem((SBuf *)&in_stack_fffffffffffffe70->c,
                          (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                          (MSize)((ulong)in_stack_fffffffffffffe60 >> 0x20));
            lj_strfmt_putint((SBuf *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),0
                            );
            local_b0 = local_100;
            local_b4 = 0x5d;
            local_40 = local_100;
            local_44 = 1;
            if (((MRef *)&(local_100->c).marked)->ptr32 == (local_100->c).nextgc.gcptr32) {
              local_38 = lj_buf_more2((SBuf *)&in_stack_fffffffffffffe60->c,
                                      in_stack_fffffffffffffe5c);
            }
            else {
              local_38 = (char *)(ulong)(local_100->c).nextgc.gcptr32;
            }
            local_c0 = local_38 + 1;
            *local_38 = (char)local_b4;
            (local_b0->c).nextgc.gcptr32 = (uint32_t)local_c0;
          }
          break;
        default:
          local_e0 = local_100;
          local_10 = local_100;
          local_14 = 1;
          local_e4 = uVar1;
          if (((MRef *)&(local_100->c).marked)->ptr32 == (local_100->c).nextgc.gcptr32) {
            local_8 = lj_buf_more2((SBuf *)&in_stack_fffffffffffffe60->c,in_stack_fffffffffffffe5c);
          }
          else {
            local_8 = (char *)(ulong)(local_100->c).nextgc.gcptr32;
          }
          local_f0 = local_8 + 1;
          *local_8 = (char)local_e4;
          (local_e0->c).nextgc.gcptr32 = (uint32_t)local_f0;
          break;
        case 0x5a:
          local_11c = (local_100->c).nextgc.gcptr32 - (local_100->c).env.gcptr32;
          break;
        case 0x70:
          goto switchD_001176fe_caseD_70;
        }
        goto LAB_001176b3;
      }
      goto LAB_00117d67;
    }
    if (local_114 == 1) break;
    local_110 = local_110 - local_120;
LAB_00117d67:
  }
  if (local_11c != 0) {
    (local_100->c).nextgc.gcptr32 = (local_100->c).env.gcptr32 + local_11c;
  }
  return;
switchD_001176fe_caseD_70:
  local_118 = 0;
  goto LAB_001176b3;
}

Assistant:

void lj_debug_dumpstack(lua_State *L, SBuf *sb, const char *fmt, int depth)
{
  int level = 0, dir = 1, pathstrip = 1;
  MSize lastlen = 0;
  if (depth < 0) { level = ~depth; depth = dir = -1; }  /* Reverse frames. */
  while (level != depth) {  /* Loop through all frame. */
    int size;
    cTValue *frame = lj_debug_frame(L, level, &size);
    if (frame) {
      cTValue *nextframe = size ? frame+size : NULL;
      GCfunc *fn = frame_func(frame);
      const uint8_t *p = (const uint8_t *)fmt;
      int c;
      while ((c = *p++)) {
	switch (c) {
	case 'p':  /* Preserve full path. */
	  pathstrip = 0;
	  break;
	case 'F': case 'f': {  /* Dump function name. */
	  const char *name;
	  const char *what = lj_debug_funcname(L, frame, &name);
	  if (what) {
	    if (c == 'F' && isluafunc(fn)) {  /* Dump module:name for 'F'. */
	      GCproto *pt = funcproto(fn);
	      if (pt->firstline != ~(BCLine)0) {  /* Not a bytecode builtin. */
		debug_putchunkname(sb, pt, pathstrip);
		lj_buf_putb(sb, ':');
	      }
	    }
	    lj_buf_putmem(sb, name, (MSize)strlen(name));
	    break;
	  }  /* else: can't derive a name, dump module:line. */
	  }
	  /* fallthrough */
	case 'l':  /* Dump module:line. */
	  if (isluafunc(fn)) {
	    GCproto *pt = funcproto(fn);
	    if (debug_putchunkname(sb, pt, pathstrip)) {
	      /* Regular Lua function. */
	      BCLine line = c == 'l' ? lj_debug_frameline(L, fn, nextframe) :
				       pt->firstline;
	      lj_buf_putb(sb, ':');
	      lj_strfmt_putint(sb, line >= 0 ? line : pt->firstline);
	    }
	  } else if (isffunc(fn)) {  /* Dump numbered builtins. */
	    lj_buf_putmem(sb, "[builtin#", 9);
	    lj_strfmt_putint(sb, fn->c.ffid);
	    lj_buf_putb(sb, ']');
	  } else {  /* Dump C function address. */
	    lj_buf_putb(sb, '@');
	    lj_strfmt_putptr(sb, fn->c.f);
	  }
	  break;
	case 'Z':  /* Zap trailing separator. */
	  lastlen = sbuflen(sb);
	  break;
	default:
	  lj_buf_putb(sb, c);
	  break;
	}
      }
    } else if (dir == 1) {
      break;
    } else {
      level -= size;  /* Reverse frame order: quickly skip missing level. */
    }
    level += dir;
  }
  if (lastlen)
    setsbufP(sb, sbufB(sb) + lastlen);  /* Zap trailing separator. */
}